

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::AddToHash(AActor *this)

{
  int iVar1;
  int hash;
  AActor *this_local;
  
  if (this->tid == 0) {
    this->iprev = (AActor **)0x0;
    this->inext = (AActor *)0x0;
  }
  else {
    iVar1 = TIDHASH(this->tid);
    this->inext = TIDHash[iVar1];
    this->iprev = TIDHash + iVar1;
    TIDHash[iVar1] = this;
    if (this->inext != (AActor *)0x0) {
      this->inext->iprev = &this->inext;
    }
  }
  return;
}

Assistant:

void AActor::AddToHash ()
{
	if (tid == 0)
	{
		iprev = NULL;
		inext = NULL;
		return;
	}
	else
	{
		int hash = TIDHASH (tid);

		inext = TIDHash[hash];
		iprev = &TIDHash[hash];
		TIDHash[hash] = this;
		if (inext)
		{
			inext->iprev = &inext;
		}
	}
}